

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfusionstyle.cpp
# Opt level: O1

QRect __thiscall
QFusionStyle::subElementRect(QFusionStyle *this,SubElement sr,QStyleOption *opt,QWidget *w)

{
  undefined4 uVar1;
  undefined4 uVar2;
  QRect *pQVar3;
  QStyleOption *pQVar4;
  long lVar5;
  ulong uVar6;
  QRect QVar7;
  undefined8 local_18;
  
  local_18 = &DAT_aaaaaaaaaaaaaaaa;
  QVar7 = QCommonStyle::subElementRect(&this->super_QCommonStyle,sr,opt,w);
  uVar6 = QVar7._8_8_;
  local_18._0_4_ = (int)QVar7._0_8_;
  local_18._4_4_ = SUB84(QVar7._0_8_,4);
  if (sr - SE_ProgressBarGroove < 3) {
    uVar6._0_4_ = (opt->rect).x2;
    uVar6._4_4_ = (opt->rect).y2;
    pQVar3 = &opt->rect;
    goto LAB_003c2619;
  }
  local_18._0_4_ = QVar7.x1.m_i;
  local_18._4_4_ = QVar7.y1.m_i;
  if (sr == SE_PushButtonFocusRect) {
    local_18._4_4_ = local_18._4_4_ + 1;
    lVar5 = -0x100000000;
  }
  else {
    pQVar3 = (QRect *)&local_18;
    if (sr != SE_DockWidgetTitleBarText) goto LAB_003c2619;
    if (((opt == (QStyleOption *)0x0) || (opt->version < 1)) || (pQVar4 = opt, opt->type != 9)) {
      pQVar4 = (QStyleOption *)0x0;
    }
    pQVar3 = (QRect *)&local_18;
    if (pQVar4 == (QStyleOption *)0x0) goto LAB_003c2619;
    if (*(char *)((long)&pQVar4[1].rect.x2.m_i + 3) != '\x01') {
      if (opt->direction == LeftToRight) {
        local_18._0_4_ = local_18._0_4_ + 4;
        pQVar3 = (QRect *)&local_18;
      }
      else {
        uVar6 = uVar6 & 0xffffffff00000000 | (ulong)(QVar7.x2.m_i.m_i - 4);
        pQVar3 = (QRect *)&local_18;
      }
      goto LAB_003c2619;
    }
    lVar5 = -0x400000000;
  }
  uVar6 = uVar6 + lVar5;
  pQVar3 = (QRect *)&local_18;
LAB_003c2619:
  uVar1 = pQVar3->x1;
  uVar2 = pQVar3->y1;
  QVar7.y1.m_i = uVar2;
  QVar7.x1.m_i = uVar1;
  QVar7.x2.m_i = (int)uVar6;
  QVar7.y2.m_i = (int)(uVar6 >> 0x20);
  return QVar7;
}

Assistant:

QRect QFusionStyle::subElementRect(SubElement sr, const QStyleOption *opt, const QWidget *w) const
{
    QRect r = QCommonStyle::subElementRect(sr, opt, w);
    switch (sr) {
    case SE_ProgressBarLabel:
    case SE_ProgressBarContents:
    case SE_ProgressBarGroove:
        return opt->rect;
    case SE_PushButtonFocusRect:
        r.adjust(0, 1, 0, -1);
        break;
    case SE_DockWidgetTitleBarText: {
        if (const QStyleOptionDockWidget *titlebar = qstyleoption_cast<const QStyleOptionDockWidget*>(opt)) {
            bool verticalTitleBar = titlebar->verticalTitleBar;
            if (verticalTitleBar) {
                r.adjust(0, 0, 0, -4);
            } else {
                if (opt->direction == Qt::LeftToRight)
                    r.adjust(4, 0, 0, 0);
                else
                    r.adjust(0, 0, -4, 0);
            }
        }

        break;
    }
    default:
        break;
    }
    return r;
}